

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

void __thiscall
Clasp::SingleOwnerPtr<Clasp::BasicSatConfig::HeuristicCreator,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::BasicSatConfig::HeuristicCreator,_Clasp::DeleteObject> *this,
          HeuristicCreator *x)

{
  HeuristicCreator *pHVar1;
  
  pHVar1 = (HeuristicCreator *)(this->ptr_ & 0xfffffffffffffffe);
  if (((this->ptr_ & 1) != 0 && pHVar1 != x) &&
     (this->ptr_ = (uintp)pHVar1, pHVar1 != (HeuristicCreator *)0x0)) {
    (*pHVar1->_vptr_HeuristicCreator[1])();
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}